

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mraa.c
# Opt level: O0

int mraa_i2c_lookup(char *i2c_name)

{
  char *__s2;
  int iVar1;
  size_t sVar2;
  int local_1c;
  int i;
  char *i2c_name_local;
  
  if (((plat != (mraa_board_t *)0x0) && (i2c_name != (char *)0x0)) &&
     (sVar2 = strlen(i2c_name), sVar2 != 0)) {
    local_1c = 0;
    do {
      if (plat->i2c_bus_count <= local_1c) {
        return -1;
      }
      if (plat->i2c_bus[local_1c].name != (char *)0x0) {
        __s2 = plat->i2c_bus[local_1c].name;
        sVar2 = strlen(plat->i2c_bus[local_1c].name);
        iVar1 = strncmp(i2c_name,__s2,sVar2 + 1);
        if (iVar1 == 0) {
          return plat->i2c_bus[local_1c].bus_id;
        }
      }
      local_1c = local_1c + 1;
    } while( true );
  }
  return -1;
}

Assistant:

int
mraa_i2c_lookup(const char* i2c_name)
{
    int i;

    if (plat == NULL) {
        return -1;
    }

    if (i2c_name == NULL || strlen(i2c_name) == 0) {
        return -1;
    }

    for (i = 0; i < plat->i2c_bus_count; i++) {
        if (plat->i2c_bus[i].name != NULL &&
            strncmp(i2c_name, plat->i2c_bus[i].name, strlen(plat->i2c_bus[i].name) + 1) == 0) {
            return plat->i2c_bus[i].bus_id;
        }
    }
    return -1;
}